

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_posix::create_formatting_impl<char>
                 (locale *in,shared_ptr<__locale_struct_*> *lc)

{
  locale *__other;
  num_format<char> *this;
  _Impl *in_RDI;
  locale *tmp;
  shared_ptr<__locale_struct_*> *in_stack_fffffffffffffef8;
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff00;
  shared_ptr<__locale_struct_*> *this_00;
  shared_ptr<__locale_struct_*> *in_stack_ffffffffffffff08;
  shared_ptr<__locale_struct_*> *lc_00;
  ctype_posix<char> *in_stack_ffffffffffffff10;
  ctype_posix<char> *in_stack_ffffffffffffff20;
  num_format<char> *__f;
  locale *in_stack_ffffffffffffff28;
  locale *in_stack_ffffffffffffff30;
  locale *this_01;
  shared_ptr<__locale_struct_*> local_88;
  locale local_78;
  undefined1 local_69;
  size_t in_stack_ffffffffffffffa0;
  locale_t in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  locale local_48 [2];
  num_format<char> local_38;
  
  local_38.lc_.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0;
  operator_new(0x78);
  std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_ffffffffffffff00);
  num_punct_posix<char>::num_punct_posix
            ((num_punct_posix<char> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::locale::locale<booster::locale::impl_posix::num_punct_posix<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (num_punct_posix<char> *)in_stack_ffffffffffffff20);
  operator_new(0x250);
  this_01 = local_48;
  std::shared_ptr<__locale_struct_*>::shared_ptr
            ((shared_ptr<__locale_struct_*> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ctype_posix<char>::ctype_posix(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::locale::locale<booster::locale::impl_posix::ctype_posix<char>>
            (this_01,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  __f = &local_38;
  std::locale::operator=((locale *)in_RDI,(locale *)__f);
  std::locale::~locale((locale *)__f);
  std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x286e9b);
  __other = (locale *)operator_new(0x20);
  local_69 = 1;
  std::shared_ptr<__locale_struct_*>::shared_ptr
            ((shared_ptr<__locale_struct_*> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  time_put_posix<char>::time_put_posix
            ((time_put_posix<char> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (size_t)in_stack_ffffffffffffff00);
  local_69 = 0;
  std::locale::locale<booster::locale::impl_posix::time_put_posix<char>>
            (this_01,__other,(time_put_posix<char> *)__f);
  lc_00 = (shared_ptr<__locale_struct_*> *)&stack0xffffffffffffffa8;
  std::locale::operator=((locale *)in_RDI,(locale *)lc_00);
  std::locale::~locale((locale *)lc_00);
  std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x286f2f);
  this = (num_format<char> *)operator_new(0x20);
  this_00 = &local_88;
  std::shared_ptr<__locale_struct_*>::shared_ptr(this_00,in_stack_fffffffffffffef8);
  num_format<char>::num_format(this,lc_00,(size_t)this_00);
  std::locale::locale<booster::locale::impl_posix::num_format<char>>(this_01,__other,__f);
  std::locale::operator=((locale *)in_RDI,&local_78);
  std::locale::~locale(&local_78);
  std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x286fbb);
  return (locale)in_RDI;
}

Assistant:

std::locale create_formatting_impl(std::locale const &in,booster::shared_ptr<locale_t> lc)
{
    std::locale tmp = std::locale(in,new num_punct_posix<CharType>(*lc));
    tmp = std::locale(tmp,new ctype_posix<CharType>(lc));
    tmp = std::locale(tmp,new time_put_posix<CharType>(lc));
    tmp = std::locale(tmp,new num_format<CharType>(lc));
    return tmp;
}